

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int stbi_zlib_decode_buffer(char *obuffer,int olen,char *ibuffer,int ilen)

{
  int iVar1;
  undefined1 local_1030 [8];
  zbuf a;
  int ilen_local;
  char *ibuffer_local;
  int olen_local;
  char *obuffer_local;
  
  a.zbuffer = (uint8 *)(ibuffer + ilen);
  local_1030 = (undefined1  [8])ibuffer;
  a._4092_4_ = ilen;
  iVar1 = do_zlib((zbuf *)local_1030,obuffer,olen,0,1);
  if (iVar1 == 0) {
    obuffer_local._4_4_ = -1;
  }
  else {
    obuffer_local._4_4_ = a.num_bits - (int)a.zout;
  }
  return obuffer_local._4_4_;
}

Assistant:

int stbi_zlib_decode_buffer(char *obuffer, int olen, char const *ibuffer, int ilen)
{
   zbuf a;
   a.zbuffer = (uint8 *) ibuffer;
   a.zbuffer_end = (uint8 *) ibuffer + ilen;
   if (do_zlib(&a, obuffer, olen, 0, 1))
      return (int) (a.zout - a.zout_start);
   else
      return -1;
}